

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

string * __thiscall
cmComputeLinkInformation::GetRPathLinkString_abi_cxx11_
          (string *__return_storage_ptr__,cmComputeLinkInformation *this)

{
  cmOrderDirectories *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rng;
  string_view separator;
  
  this_00 = (this->OrderDependentRPath)._M_t.
            super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>._M_t
            .super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>.
            super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl;
  if (this_00 == (cmOrderDirectories *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    rng = cmOrderDirectories::GetOrderedDirectories_abi_cxx11_(this_00);
    separator._M_str = ":";
    separator._M_len = 1;
    cmJoin(__return_storage_ptr__,rng,separator,(string_view)ZEXT816(0));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmComputeLinkInformation::GetRPathLinkString() const
{
  // If there is no separate linker runtime search flag (-rpath-link)
  // there is no reason to compute a string.
  if (!this->OrderDependentRPath) {
    return "";
  }

  // Construct the linker runtime search path. These MUST NOT contain tokens
  // such as $ORIGIN, see https://sourceware.org/bugzilla/show_bug.cgi?id=16936
  return cmJoin(this->OrderDependentRPath->GetOrderedDirectories(), ":");
}